

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::SetConnectIndex
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int i,int64_t connectindex)

{
  int iVar1;
  ostream *poVar2;
  
  if (-1 < i) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))();
    if (i < iVar1) {
      (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)i] = connectindex;
      return;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout," TPZCompElHDiv<TSHAPE>::SetConnectIndex index ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
  std::operator<<(poVar2," out of range\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp",
             0xdd);
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetConnectIndex(int i, int64_t connectindex){
#ifndef PZNODEBUG
	if(i<0 || i>= this->NConnects()) {
		std::cout << " TPZCompElHDiv<TSHAPE>::SetConnectIndex index " << i <<
		" out of range\n";
		DebugStop();
		return;
	}
#endif
	this-> fConnectIndexes[i] = connectindex;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << endl<<"Setting Connect : " << i << " to connectindex " << connectindex<<std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}